

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_emu_d3d56.cc
# Opt level: O0

void __thiscall hwtest::pgraph::MthdEmuEmuD3D0TexFilter::emulate_mthd(MthdEmuEmuD3D0TexFilter *this)

{
  MthdEmuEmuD3D0TexFilter *this_local;
  
  pgraph_celsius_pre_icmd(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp);
  if (-1 < (long)((ulong)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource <<
                 0x3e)) {
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_tex_filter[0] =
         (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_tex_filter[0] &
         0xffffe000 |
         (uint)(((long)((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x28) >> 0x38 &
                0x1ffU) << 4);
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_tex_filter[1] =
         (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_tex_filter[1] &
         0xffffe000 |
         (uint)(((long)((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x28) >> 0x38 &
                0x1ffU) << 4);
    pgraph_celsius_icmd(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,0xe,
                        (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
                        bundle_tex_filter[0],false);
    pgraph_celsius_icmd(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,0xf,
                        (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
                        bundle_tex_filter[1],true);
  }
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid[1] =
       (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid[1] & 0xff7fffff |
       0x800000;
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid[1] =
       (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid[1] & 0xfffeffff |
       0x10000;
  return;
}

Assistant:

void emulate_mthd() override {
		pgraph_celsius_pre_icmd(&exp);
		if (!extr(exp.nsource, 1, 1)) {
			insrt(exp.bundle_tex_filter[0], 0, 13, extrs(val, 16, 8) << 4);
			insrt(exp.bundle_tex_filter[1], 0, 13, extrs(val, 16, 8) << 4);
			pgraph_celsius_icmd(&exp, 0xe, exp.bundle_tex_filter[0], false);
			pgraph_celsius_icmd(&exp, 0xf, exp.bundle_tex_filter[1], true);
		}
		insrt(exp.valid[1], 23, 1, 1);
		insrt(exp.valid[1], 16, 1, 1);
	}